

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O3

void add_game(Game *game)

{
  long lVar1;
  
  lVar1 = gamesCount * 8;
  gamesCount = gamesCount + 1;
  games = (Game **)realloc(games,lVar1 + 8);
  games[gamesCount - 1] = game;
  return;
}

Assistant:

void add_game(Game * game)
{
	gamesCount++;
	// cppcheck-suppress memleakOnRealloc
	games = (Game **)realloc(games, sizeof(Game *)*gamesCount); 
	games[(gamesCount-1)] = game;
}